

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparser.h
# Opt level: O1

cli_arguments_t *
parse_arguments_abi_cxx11_(cli_arguments_t *__return_storage_ptr__,int argc,char **argv)

{
  bool bVar1;
  cli_arguments_t *pcVar2;
  int iVar3;
  int iVar4;
  positional_arguments_t positional_arguments;
  string arg;
  named_arguments_t named_arguments;
  long *local_d0 [2];
  long local_c0 [2];
  char *local_b0;
  vector<const_char_*,_std::allocator<const_char_*>_> local_a8;
  long *local_90;
  long local_88;
  long local_80 [2];
  cli_arguments_t *local_70;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (char **)0x0;
  local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (char **)0x0;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_70 = __return_storage_ptr__;
  if (1 < argc) {
    iVar4 = 1;
    do {
      std::__cxx11::string::string((string *)&local_90,argv[iVar4],(allocator *)local_d0);
      if (((char)*local_90 == '-') && (*(char *)((long)local_90 + 1) == '-')) {
        std::__cxx11::string::substr((ulong)local_d0,(ulong)&local_90);
        std::__cxx11::string::operator=((string *)&local_90,(string *)local_d0);
        if (local_d0[0] != local_c0) {
          operator_delete(local_d0[0],local_c0[0] + 1);
        }
        iVar3 = std::__cxx11::string::compare((char *)&local_90);
        if (iVar3 == 0) {
          local_d0[0] = local_c0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_d0,local_90,(char *)((long)local_90 + local_88));
          local_b0 = "";
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,char_const*>,std::allocator<std::pair<std::__cxx11::string_const,char_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<std::__cxx11::string,char_const*>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,char_const*>,std::allocator<std::pair<std::__cxx11::string_const,char_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&local_68,(string *)local_d0);
          if (local_d0[0] != local_c0) {
            operator_delete(local_d0[0],local_c0[0] + 1);
          }
          bVar1 = true;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&local_90);
          if (iVar3 != 0) {
            iVar3 = std::__cxx11::string::compare((char *)&local_90);
            if (iVar3 != 0) {
              local_d0[0] = local_c0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_d0,local_90,(char *)((long)local_90 + local_88));
              iVar4 = iVar4 + 1;
              local_b0 = argv[iVar4];
              std::
              _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,char_const*>,std::allocator<std::pair<std::__cxx11::string_const,char_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              ::_M_emplace<std::pair<std::__cxx11::string,char*>>
                        ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,char_const*>,std::allocator<std::pair<std::__cxx11::string_const,char_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                          *)&local_68,(string *)local_d0);
              if (local_d0[0] != local_c0) {
                operator_delete(local_d0[0],local_c0[0] + 1);
              }
              bVar1 = false;
              goto LAB_001222c7;
            }
          }
          local_d0[0] = local_c0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_d0,local_90,(char *)((long)local_90 + local_88));
          local_b0 = "true";
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,char_const*>,std::allocator<std::pair<std::__cxx11::string_const,char_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<std::__cxx11::string,char_const*>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,char_const*>,std::allocator<std::pair<std::__cxx11::string_const,char_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&local_68,(string *)local_d0);
          if (local_d0[0] != local_c0) {
            operator_delete(local_d0[0],local_c0[0] + 1);
          }
LAB_0012220b:
          bVar1 = false;
        }
      }
      else {
        if (local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          *local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
           super__Vector_impl_data._M_finish = argv[iVar4];
          local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
          goto LAB_0012220b;
        }
        bVar1 = false;
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_a8,
                   (iterator)
                   local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                   super__Vector_impl_data._M_finish,argv + iVar4);
      }
LAB_001222c7:
      if (local_90 != local_80) {
        operator_delete(local_90,local_80[0] + 1);
      }
    } while ((!bVar1) && (iVar4 = iVar4 + 1, iVar4 < argc));
  }
  pcVar2 = local_70;
  std::
  pair<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>_>
  ::
  pair<std::vector<const_char_*,_std::allocator<const_char_*>_>_&,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>_&,_true>
            (local_70,&local_a8,
             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
              *)&local_68);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  if (local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return pcVar2;
}

Assistant:

const cli_arguments_t parse_arguments(int argc, char** argv) {
	positional_arguments_t positional_arguments;
	named_arguments_t named_arguments;

	for (int i = 1; i < argc; ++i) {
		std::string arg(argv[i]);

		if (arg[0] != '-' || arg[1] != '-') {
			positional_arguments.push_back(argv[i]);
			continue;
		}

		// We have a named argument, check if we should have extra data attached to it
		arg = arg.substr(2);

		// For the help command, there is no additional data, and we can stop parsing
		if (arg == "help") {
			named_arguments.insert(std::make_pair(arg, ""));
			break;
		}

		// Also components and undirected has no data attached to it.
		// TODO: How to make this nicer without a lot of overhead
		if (arg == "components" || arg == "undirected") {
			named_arguments.insert(std::make_pair(arg, "true"));
			continue;
		}

		// We have extra data, so parse it
		named_arguments.insert(std::make_pair(arg, argv[++i]));
	}

	return std::make_pair(positional_arguments, named_arguments);
}